

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O0

Function * input(string *s)

{
  Function *pFVar1;
  string local_30;
  string *local_10;
  string *s_local;
  
  local_10 = s;
  pFVar1 = inputX();
  std::__cxx11::string::string((string *)&local_30,(string *)s);
  pFVar1 = Function::setName(pFVar1,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return pFVar1;
}

Assistant:

Function &input(string s)
{
	return inputX().setName(s);
}